

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

Maybe<const_capnp::word_&>
capnp::_::WireHelpers::followFars(WirePointer **ref,word *refTarget,SegmentReader **segment)

{
  bool bVar1;
  Kind KVar2;
  int iVar3;
  Id<unsigned_int,_capnp::_::Segment> IVar4;
  Arena *pAVar5;
  undefined4 extraout_var;
  WirePointer *this;
  word *pwVar6;
  undefined4 extraout_var_00;
  Fault local_90;
  Fault f_4;
  Fault f_3;
  Fault f_2;
  SegmentReader *newSegment;
  WirePointer *pad;
  Fault f_1;
  uint padWords;
  word *ptr;
  Fault local_38;
  Fault f;
  SegmentReader **segment_local;
  word *refTarget_local;
  WirePointer **ref_local;
  
  if ((*segment == (SegmentReader *)0x0) || (KVar2 = WirePointer::kind(*ref), KVar2 != FAR)) {
    if (refTarget != (word *)0x0) {
      kj::Maybe<const_capnp::word_&>::Maybe((Maybe<const_capnp::word_&> *)&ref_local,refTarget);
      return (Maybe<const_capnp::word_&>)(word *)ref_local;
    }
    kj::_::Debug::Fault::Fault
              (&local_90,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
               ,0x259,FAILED,"refTarget != nullptr","");
    kj::_::Debug::Fault::fatal(&local_90);
  }
  pAVar5 = SegmentReader::getArena(*segment);
  f.exception._4_4_ =
       DirectWireValue<kj::Id<unsigned_int,_capnp::_::Segment>_>::get
                 ((DirectWireValue<kj::Id<unsigned_int,_capnp::_::Segment>_> *)
                  &((*ref)->field_1).structRef);
  iVar3 = (*pAVar5->_vptr_Arena[2])(pAVar5,(ulong)f.exception._4_4_);
  *segment = (SegmentReader *)CONCAT44(extraout_var,iVar3);
  if (*segment == (SegmentReader *)0x0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[49]>
              (&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
               ,0x234,FAILED,"segment != nullptr",
               "\"Message contains far pointer to unknown segment.\"",
               (char (*) [49])"Message contains far pointer to unknown segment.");
    kj::Maybe<const_capnp::word_&>::Maybe((Maybe<const_capnp::word_&> *)&ref_local,(void *)0x0);
    kj::_::Debug::Fault::~Fault(&local_38);
    return (Maybe<const_capnp::word_&>)(word *)ref_local;
  }
  this = (WirePointer *)WirePointer::farTarget(*ref,*segment);
  bVar1 = WirePointer::isDoubleFar(*ref);
  bVar1 = bounded<bool>(bVar1);
  f_1.exception._4_4_ = bVar1 + 1;
  bVar1 = boundsCheck(*segment,(word *)this,f_1.exception._4_4_);
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[44]>
              ((Fault *)&pad,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
               ,0x23c,FAILED,"boundsCheck(segment, ptr, padWords)",
               "\"Message contains out-of-bounds far pointer.\"",
               (char (*) [44])"Message contains out-of-bounds far pointer.");
    kj::Maybe<const_capnp::word_&>::Maybe((Maybe<const_capnp::word_&> *)&ref_local,(void *)0x0);
    kj::_::Debug::Fault::~Fault((Fault *)&pad);
    return (Maybe<const_capnp::word_&>)(word *)ref_local;
  }
  bVar1 = WirePointer::isDoubleFar(*ref);
  if (!bVar1) {
    *ref = this;
    pwVar6 = WirePointer::target(this,*segment);
    kj::Maybe<const_capnp::word_&>::Maybe((Maybe<const_capnp::word_&> *)&ref_local,pwVar6);
    return (Maybe<const_capnp::word_&>)(word *)ref_local;
  }
  *ref = this + 1;
  pAVar5 = SegmentReader::getArena(*segment);
  IVar4 = DirectWireValue<kj::Id<unsigned_int,_capnp::_::Segment>_>::get
                    ((DirectWireValue<kj::Id<unsigned_int,_capnp::_::Segment>_> *)
                     &(this->field_1).structRef);
  iVar3 = (*pAVar5->_vptr_Arena[2])(pAVar5,(ulong)IVar4.value);
  if ((SegmentReader *)CONCAT44(extraout_var_00,iVar3) != (SegmentReader *)0x0) {
    KVar2 = WirePointer::kind(this);
    if (KVar2 == FAR) {
      *segment = (SegmentReader *)CONCAT44(extraout_var_00,iVar3);
      pwVar6 = WirePointer::farTarget(this,*segment);
      kj::Maybe<const_capnp::word_&>::Maybe((Maybe<const_capnp::word_&> *)&ref_local,pwVar6);
      return (Maybe<const_capnp::word_&>)(word *)ref_local;
    }
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[51]>
              (&f_4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
               ,0x252,FAILED,"pad->kind() == WirePointer::FAR",
               "\"Second word of double-far pad must be far pointer.\"",
               (char (*) [51])"Second word of double-far pad must be far pointer.");
    kj::Maybe<const_capnp::word_&>::Maybe((Maybe<const_capnp::word_&> *)&ref_local,(void *)0x0);
    kj::_::Debug::Fault::~Fault(&f_4);
    return (Maybe<const_capnp::word_&>)(word *)ref_local;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[56]>
            (&f_3,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
             ,0x24e,FAILED,"newSegment != nullptr",
             "\"Message contains double-far pointer to unknown segment.\"",
             (char (*) [56])"Message contains double-far pointer to unknown segment.");
  kj::Maybe<const_capnp::word_&>::Maybe((Maybe<const_capnp::word_&> *)&ref_local,(void *)0x0);
  kj::_::Debug::Fault::~Fault(&f_3);
  return (Maybe<const_capnp::word_&>)(word *)ref_local;
}

Assistant:

static KJ_ALWAYS_INLINE(kj::Maybe<const word&> followFars(
      const WirePointer*& ref, const word* refTarget, SegmentReader*& segment))
      KJ_WARN_UNUSED_RESULT {
    // Like the other followFars() but operates on readers.

    // If the segment is null, this is an unchecked message, so there are no FAR pointers.
    if (segment != nullptr && ref->kind() == WirePointer::FAR) {
      // Look up the segment containing the landing pad.
      segment = segment->getArena()->tryGetSegment(ref->farRef.segmentId.get());
      KJ_REQUIRE(segment != nullptr, "Message contains far pointer to unknown segment.") {
        return nullptr;
      }

      // Find the landing pad and check that it is within bounds.
      const word* ptr = ref->farTarget(segment);
      auto padWords = (ONE + bounded(ref->isDoubleFar())) * POINTER_SIZE_IN_WORDS;
      KJ_REQUIRE(boundsCheck(segment, ptr, padWords),
                 "Message contains out-of-bounds far pointer.") {
        return nullptr;
      }

      const WirePointer* pad = reinterpret_cast<const WirePointer*>(ptr);

      // If this is not a double-far then the landing pad is our final pointer.
      if (!ref->isDoubleFar()) {
        ref = pad;
        return pad->target(segment);
      }

      // Landing pad is another far pointer.  It is followed by a tag describing the pointed-to
      // object.
      ref = pad + 1;

      SegmentReader* newSegment = segment->getArena()->tryGetSegment(pad->farRef.segmentId.get());
      KJ_REQUIRE(newSegment != nullptr,
          "Message contains double-far pointer to unknown segment.") {
        return nullptr;
      }
      KJ_REQUIRE(pad->kind() == WirePointer::FAR,
          "Second word of double-far pad must be far pointer.") {
        return nullptr;
      }

      segment = newSegment;
      return pad->farTarget(segment);
    } else {
      KJ_DASSERT(refTarget != nullptr);
      return refTarget;
    }
  }